

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

void __thiscall
HighsSparseMatrix::alphaProductPlusY
          (HighsSparseMatrix *this,double alpha,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,bool transpose)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  double dVar11;
  
  if (this->format_ == kColwise) {
    uVar1 = this->num_col_;
    if (transpose) {
      if (0 < (int)uVar1) {
        piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 0;
        iVar9 = *piVar3;
        do {
          iVar2 = piVar3[uVar10 + 1];
          if (iVar9 < iVar2) {
            dVar11 = pdVar7[uVar10];
            lVar8 = (long)iVar9;
            do {
              dVar11 = dVar11 + pdVar5[lVar8] * alpha * pdVar6[piVar4[lVar8]];
              pdVar7[uVar10] = dVar11;
              lVar8 = lVar8 + 1;
            } while (iVar2 != lVar8);
          }
          uVar10 = uVar10 + 1;
          iVar9 = iVar2;
        } while (uVar10 != uVar1);
      }
    }
    else if (0 < (int)uVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      iVar9 = *piVar3;
      do {
        iVar2 = piVar3[uVar10 + 1];
        if (iVar9 < iVar2) {
          lVar8 = (long)iVar9;
          do {
            iVar9 = piVar4[lVar8];
            pdVar7[iVar9] = pdVar5[lVar8] * alpha * pdVar6[uVar10] + pdVar7[iVar9];
            lVar8 = lVar8 + 1;
          } while (iVar2 != lVar8);
        }
        uVar10 = uVar10 + 1;
        iVar9 = iVar2;
      } while (uVar10 != uVar1);
    }
  }
  else {
    uVar1 = this->num_row_;
    if (transpose) {
      if (0 < (int)uVar1) {
        piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 0;
        iVar9 = *piVar3;
        do {
          iVar2 = piVar3[uVar10 + 1];
          if (iVar9 < iVar2) {
            lVar8 = (long)iVar9;
            do {
              iVar9 = piVar4[lVar8];
              pdVar7[iVar9] = pdVar5[lVar8] * alpha * pdVar6[uVar10] + pdVar7[iVar9];
              lVar8 = lVar8 + 1;
            } while (iVar2 != lVar8);
          }
          uVar10 = uVar10 + 1;
          iVar9 = iVar2;
        } while (uVar10 != uVar1);
      }
    }
    else if (0 < (int)uVar1) {
      piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar4 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = 0;
      iVar9 = *piVar3;
      do {
        iVar2 = piVar3[uVar10 + 1];
        if (iVar9 < iVar2) {
          dVar11 = pdVar7[uVar10];
          lVar8 = (long)iVar9;
          do {
            dVar11 = dVar11 + pdVar5[lVar8] * alpha * pdVar6[piVar4[lVar8]];
            pdVar7[uVar10] = dVar11;
            lVar8 = lVar8 + 1;
          } while (iVar2 != lVar8);
        }
        uVar10 = uVar10 + 1;
        iVar9 = iVar2;
      } while (uVar10 != uVar1);
    }
  }
  return;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}